

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

Token * __thiscall inja::Lexer::scan(Token *__return_storage_ptr__,Lexer *this)

{
  LexerConfig *pLVar1;
  string_view close_trim;
  int iVar2;
  size_type __rlen;
  size_type sVar3;
  Lexer *this_00;
  size_t sVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  Kind closeKind;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  bool bVar12;
  string_view sVar13;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  basic_string_view<char,_std::char_traits<char>_> __str_05;
  basic_string_view<char,_std::char_traits<char>_> __str_06;
  basic_string_view<char,_std::char_traits<char>_> __str_07;
  string_view text;
  string_view close;
  char *pcVar14;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  size_t local_58;
  char *pcStack_50;
  size_t local_48;
  char *pcStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  uVar6 = (this->m_in)._M_len;
  uVar9 = this->pos;
  this->tok_start = uVar9;
  if (uVar6 <= uVar9) {
LAB_0012c7c9:
    pcVar10 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = Eof;
    (__return_storage_ptr__->text)._M_len = 0;
LAB_0012c7db:
    (__return_storage_ptr__->text)._M_str = pcVar10;
    return __return_storage_ptr__;
  }
LAB_0012c4f5:
  switch(this->state) {
  case ExpressionStart:
    this->state = ExpressionBody;
    uVar11 = this->pos + (this->config->expression_open)._M_string_length;
    goto LAB_0012c99b;
  case ExpressionStartForceLstrip:
    this->state = ExpressionBody;
    uVar11 = this->pos + (this->config->expression_open_force_lstrip)._M_string_length;
LAB_0012c99b:
    this->pos = uVar11;
    if (uVar6 < uVar9) {
      uVar9 = uVar6;
    }
    if (uVar11 < uVar9) {
      uVar11 = uVar9;
    }
    if (uVar6 <= uVar11) {
      uVar11 = uVar6;
    }
    uVar7 = uVar6 - uVar9;
    if (uVar11 - uVar9 <= uVar6 - uVar9) {
      uVar7 = uVar11 - uVar9;
    }
    pcVar10 = (this->m_in)._M_str + uVar9;
    __return_storage_ptr__->kind = ExpressionOpen;
    goto LAB_0012ca70;
  case ExpressionBody:
    pLVar1 = this->config;
    pcVar10 = (pLVar1->expression_close)._M_dataplus._M_p;
    sVar8 = (pLVar1->expression_close)._M_string_length;
    pcVar14 = (pLVar1->expression_close_force_rstrip)._M_dataplus._M_p;
    sVar4 = (pLVar1->expression_close_force_rstrip)._M_string_length;
    closeKind = ExpressionClose;
    local_48 = sVar4;
    pcStack_40 = pcVar14;
    goto LAB_0012c91d;
  case LineStart:
    this->state = LineBody;
    uVar11 = this->pos + (this->config->line_statement)._M_string_length;
    this->pos = uVar11;
    if (uVar6 < uVar9) {
      uVar9 = uVar6;
    }
    if (uVar11 < uVar9) {
      uVar11 = uVar9;
    }
    if (uVar6 <= uVar11) {
      uVar11 = uVar6;
    }
    uVar7 = uVar6 - uVar9;
    if (uVar11 - uVar9 <= uVar6 - uVar9) {
      uVar7 = uVar11 - uVar9;
    }
    pcVar10 = (this->m_in)._M_str + uVar9;
    __return_storage_ptr__->kind = LineStatementOpen;
    goto LAB_0012ca70;
  case LineBody:
    local_38 = 0;
    uStack_30 = 0;
    sVar4 = 0;
    pcVar14 = (char *)0x0;
    pcVar10 = "\n";
    sVar8 = 1;
    closeKind = LineStatementClose;
LAB_0012c91d:
    bVar12 = false;
LAB_0012caba:
    close_trim._M_str = pcVar14;
    close_trim._M_len = sVar4;
    close._M_str = pcVar10;
    close._M_len = sVar8;
    scan_body(__return_storage_ptr__,this,close,closeKind,close_trim,bVar12);
    return __return_storage_ptr__;
  case StatementStart:
    this->state = StatementBody;
    uVar11 = this->pos + (this->config->statement_open)._M_string_length;
    break;
  case StatementStartNoLstrip:
    this->state = StatementBody;
    uVar11 = this->pos + (this->config->statement_open_no_lstrip)._M_string_length;
    break;
  case StatementStartForceLstrip:
    this->state = StatementBody;
    uVar11 = this->pos + (this->config->statement_open_force_lstrip)._M_string_length;
    break;
  case StatementBody:
    pLVar1 = this->config;
    pcVar10 = (pLVar1->statement_close)._M_dataplus._M_p;
    sVar8 = (pLVar1->statement_close)._M_string_length;
    pcVar14 = (pLVar1->statement_close_force_rstrip)._M_dataplus._M_p;
    sVar4 = (pLVar1->statement_close_force_rstrip)._M_string_length;
    bVar12 = pLVar1->trim_blocks;
    closeKind = StatementClose;
    local_58 = sVar4;
    pcStack_50 = pcVar14;
    goto LAB_0012caba;
  case CommentStart:
    this->state = CommentBody;
    uVar11 = this->pos + (this->config->comment_open)._M_string_length;
    goto LAB_0012ca40;
  case CommentStartForceLstrip:
    this->state = CommentBody;
    uVar11 = this->pos + (this->config->comment_open_force_lstrip)._M_string_length;
LAB_0012ca40:
    this->pos = uVar11;
    if (uVar6 < uVar9) {
      uVar9 = uVar6;
    }
    if (uVar11 < uVar9) {
      uVar11 = uVar9;
    }
    if (uVar6 <= uVar11) {
      uVar11 = uVar6;
    }
    uVar7 = uVar6 - uVar9;
    if (uVar11 - uVar9 <= uVar6 - uVar9) {
      uVar7 = uVar11 - uVar9;
    }
    pcVar10 = (this->m_in)._M_str + uVar9;
    __return_storage_ptr__->kind = CommentOpen;
    goto LAB_0012ca70;
  case CommentBody:
    uVar9 = this->pos;
    if (uVar6 < uVar9) {
LAB_0012cbd4:
      ::std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar9);
    }
    local_68._M_str = (this->m_in)._M_str + uVar9;
    local_68._M_len = uVar6 - uVar9;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (&local_68,(this->config->comment_close)._M_dataplus._M_p,0,
                       (this->config->comment_close)._M_string_length);
    if (sVar3 != 0xffffffffffffffff) {
      uVar6 = (this->m_in)._M_len;
      uVar9 = (sVar3 + this->pos) - 1;
      uVar11 = uVar6 - uVar9;
      if (uVar9 <= uVar6) {
        local_68._M_str = (this->m_in)._M_str + uVar9;
        uVar6 = (this->config->comment_close_force_rstrip)._M_string_length;
        local_68._M_len = uVar11;
        if (uVar11 < uVar6) {
          bVar12 = false;
        }
        else {
          __str_07._M_str = (this->config->comment_close_force_rstrip)._M_dataplus._M_p;
          __str_07._M_len = uVar6;
          iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            (&local_68,0,uVar6,__str_07);
          bVar12 = iVar2 == 0;
        }
        this->state = Text;
        pLVar1 = this->config;
        uVar6 = (this->m_in)._M_len;
        uVar11 = sVar3 + (pLVar1->comment_close)._M_string_length + this->pos;
        this->pos = uVar11;
        uVar9 = this->tok_start;
        if (uVar6 < this->tok_start) {
          uVar9 = uVar6;
        }
        if (uVar11 < uVar9) {
          uVar11 = uVar9;
        }
        if (uVar6 <= uVar11) {
          uVar11 = uVar6;
        }
        uVar7 = uVar6 - uVar9;
        if (uVar11 - uVar9 <= uVar6 - uVar9) {
          uVar7 = uVar11 - uVar9;
        }
        pcVar10 = (this->m_in)._M_str;
        __return_storage_ptr__->kind = CommentClose;
        (__return_storage_ptr__->text)._M_len = uVar7;
        (__return_storage_ptr__->text)._M_str = pcVar10 + uVar9;
        if ((!bVar12) && (pLVar1->trim_blocks != true)) {
          return __return_storage_ptr__;
        }
        skip_whitespaces_and_first_newline(this);
        return __return_storage_ptr__;
      }
      goto LAB_0012cbd4;
    }
    uVar6 = (this->m_in)._M_len;
    uVar9 = this->tok_start;
    if (uVar6 < this->tok_start) {
      uVar9 = uVar6;
    }
    this->pos = uVar6;
    sVar4 = uVar6 - uVar9;
    pcVar10 = (this->m_in)._M_str + uVar9;
    __return_storage_ptr__->kind = Eof;
LAB_0012cb22:
    (__return_storage_ptr__->text)._M_len = sVar4;
    goto LAB_0012c7db;
  default:
    uVar9 = this->pos;
    if (uVar6 < uVar9) goto LAB_0012cbd4;
    local_68._M_str = (this->m_in)._M_str + uVar9;
    local_68._M_len = uVar6 - uVar9;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (&local_68,(this->config->open_chars)._M_dataplus._M_p,0,
                       (this->config->open_chars)._M_string_length);
    if (sVar3 == 0xffffffffffffffff) {
      uVar6 = (this->m_in)._M_len;
      uVar9 = this->tok_start;
      if (uVar6 < this->tok_start) {
        uVar9 = uVar6;
      }
      this->pos = uVar6;
      sVar4 = uVar6 - uVar9;
      pcVar10 = (this->m_in)._M_str + uVar9;
      __return_storage_ptr__->kind = Text;
      goto LAB_0012cb22;
    }
    uVar9 = sVar3 + this->pos;
    this->pos = uVar9;
    uVar6 = (this->m_in)._M_len;
    uVar11 = uVar6 - uVar9;
    if (uVar6 < uVar9) goto LAB_0012cbd4;
    pcVar10 = (this->m_in)._M_str + uVar9;
    uVar6 = (this->config->expression_open)._M_string_length;
    if ((uVar11 < uVar6) ||
       (__str._M_str = (this->config->expression_open)._M_dataplus._M_p, __str._M_len = uVar6,
       local_68._M_len = uVar11, local_68._M_str = pcVar10,
       iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                         (&local_68,0,uVar6,__str), iVar2 != 0)) {
      uVar6 = (this->config->statement_open)._M_string_length;
      if ((uVar6 <= uVar11) &&
         (__str_00._M_str = (this->config->statement_open)._M_dataplus._M_p, __str_00._M_len = uVar6
         , local_68._M_len = uVar11, local_68._M_str = pcVar10,
         iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           (&local_68,0,uVar6,__str_00), iVar2 == 0)) {
        uVar6 = (this->config->statement_open_no_lstrip)._M_string_length;
        if ((uVar6 <= uVar11) &&
           (__str_04._M_str = (this->config->statement_open_no_lstrip)._M_dataplus._M_p,
           __str_04._M_len = uVar6, local_68._M_len = uVar11, local_68._M_str = pcVar10,
           iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             (&local_68,0,uVar6,__str_04), iVar2 == 0)) {
          this->state = StatementStartNoLstrip;
          goto LAB_0012c756;
        }
        uVar6 = (this->config->statement_open_force_lstrip)._M_string_length;
        local_68._M_len = uVar11;
        local_68._M_str = pcVar10;
        if ((uVar6 <= uVar11) &&
           (__str_05._M_str = (this->config->statement_open_force_lstrip)._M_dataplus._M_p,
           __str_05._M_len = uVar6,
           iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             (&local_68,0,uVar6,__str_05), iVar2 == 0)) {
          this->state = StatementStartForceLstrip;
          goto LAB_0012c76c;
        }
        this->state = StatementStart;
LAB_0012c72f:
        cVar5 = this->config->lstrip_blocks;
        goto LAB_0012c76e;
      }
      uVar6 = (this->config->comment_open)._M_string_length;
      local_68._M_len = uVar11;
      local_68._M_str = pcVar10;
      if ((uVar6 <= uVar11) &&
         (__str_01._M_str = (this->config->comment_open)._M_dataplus._M_p, __str_01._M_len = uVar6,
         iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           (&local_68,0,uVar6,__str_01), iVar2 == 0)) {
        uVar6 = (this->config->comment_open_force_lstrip)._M_string_length;
        local_68._M_len = uVar11;
        local_68._M_str = pcVar10;
        if ((uVar6 <= uVar11) &&
           (__str_06._M_str = (this->config->comment_open_force_lstrip)._M_dataplus._M_p,
           __str_06._M_len = uVar6,
           iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             (&local_68,0,uVar6,__str_06), iVar2 == 0)) {
          this->state = CommentStartForceLstrip;
          goto LAB_0012c76c;
        }
        this->state = CommentStart;
        goto LAB_0012c72f;
      }
      if ((this->pos == 0) || ((this->m_in)._M_str[this->pos - 1] == '\n')) {
        uVar6 = (this->config->line_statement)._M_string_length;
        local_68._M_len = uVar11;
        local_68._M_str = pcVar10;
        if ((uVar6 <= uVar11) &&
           (__str_02._M_str = (this->config->line_statement)._M_dataplus._M_p,
           __str_02._M_len = uVar6,
           iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             (&local_68,0,uVar6,__str_02), iVar2 == 0)) {
          this->state = LineStart;
          goto LAB_0012c756;
        }
      }
      this->pos = this->pos + 1;
    }
    else {
      uVar6 = (this->config->expression_open_force_lstrip)._M_string_length;
      local_68._M_len = uVar11;
      local_68._M_str = pcVar10;
      if ((uVar11 < uVar6) ||
         (__str_03._M_str = (this->config->expression_open_force_lstrip)._M_dataplus._M_p,
         __str_03._M_len = uVar6,
         iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           (&local_68,0,uVar6,__str_03), iVar2 != 0)) {
        this->state = ExpressionStart;
LAB_0012c756:
        cVar5 = '\0';
      }
      else {
        this->state = ExpressionStartForceLstrip;
LAB_0012c76c:
        cVar5 = '\x01';
      }
LAB_0012c76e:
      uVar6 = (this->m_in)._M_len;
      uVar9 = this->tok_start;
      if (uVar6 < this->tok_start) {
        uVar9 = uVar6;
      }
      uVar11 = this->pos;
      if (this->pos < uVar9) {
        uVar11 = uVar9;
      }
      if (uVar6 <= uVar11) {
        uVar11 = uVar6;
      }
      this_00 = (Lexer *)(uVar6 - uVar9);
      if ((Lexer *)(uVar11 - uVar9) <= (Lexer *)(uVar6 - uVar9)) {
        this_00 = (Lexer *)(uVar11 - uVar9);
      }
      text._M_str = (this->m_in)._M_str + uVar9;
      sVar13._M_str = text._M_str;
      sVar13._M_len = (size_t)this_00;
      if (cVar5 != '\0') {
        text._M_len = (size_t)text._M_str;
        sVar13 = clear_final_line_if_whitespace(this_00,text);
      }
      if (sVar13._M_len != 0) {
        __return_storage_ptr__->kind = Text;
        __return_storage_ptr__->text = sVar13;
        return __return_storage_ptr__;
      }
    }
    uVar6 = (this->m_in)._M_len;
    uVar9 = this->tok_start;
    if (uVar6 <= uVar9) goto LAB_0012c7c9;
    goto LAB_0012c4f5;
  }
  this->pos = uVar11;
  if (uVar6 < uVar9) {
    uVar9 = uVar6;
  }
  if (uVar11 < uVar9) {
    uVar11 = uVar9;
  }
  if (uVar6 <= uVar11) {
    uVar11 = uVar6;
  }
  uVar7 = uVar6 - uVar9;
  if (uVar11 - uVar9 <= uVar6 - uVar9) {
    uVar7 = uVar11 - uVar9;
  }
  pcVar10 = (this->m_in)._M_str + uVar9;
  __return_storage_ptr__->kind = StatementOpen;
LAB_0012ca70:
  (__return_storage_ptr__->text)._M_len = uVar7;
  (__return_storage_ptr__->text)._M_str = pcVar10;
  return __return_storage_ptr__;
}

Assistant:

Token scan() {
    tok_start = pos;

  again:
    if (tok_start >= m_in.size()) {
      return make_token(Token::Kind::Eof);
    }

    switch (state) {
    default:
    case State::Text: {
      // fast-scan to first open character
      const size_t open_start = m_in.substr(pos).find_first_of(config.open_chars);
      if (open_start == std::string_view::npos) {
        // didn't find open, return remaining text as text token
        pos = m_in.size();
        return make_token(Token::Kind::Text);
      }
      pos += open_start;

      // try to match one of the opening sequences, and get the close
      const std::string_view open_str = m_in.substr(pos);
      bool must_lstrip = false;
      if (inja::string_view::starts_with(open_str, config.expression_open)) {
        if (inja::string_view::starts_with(open_str, config.expression_open_force_lstrip)) {
          state = State::ExpressionStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::ExpressionStart;
        }
      } else if (inja::string_view::starts_with(open_str, config.statement_open)) {
        if (inja::string_view::starts_with(open_str, config.statement_open_no_lstrip)) {
          state = State::StatementStartNoLstrip;
        } else if (inja::string_view::starts_with(open_str, config.statement_open_force_lstrip)) {
          state = State::StatementStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::StatementStart;
          must_lstrip = config.lstrip_blocks;
        }
      } else if (inja::string_view::starts_with(open_str, config.comment_open)) {
        if (inja::string_view::starts_with(open_str, config.comment_open_force_lstrip)) {
          state = State::CommentStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::CommentStart;
          must_lstrip = config.lstrip_blocks;
        }
      } else if ((pos == 0 || m_in[pos - 1] == '\n') && inja::string_view::starts_with(open_str, config.line_statement)) {
        state = State::LineStart;
      } else {
        pos += 1; // wasn't actually an opening sequence
        goto again;
      }

      std::string_view text = string_view::slice(m_in, tok_start, pos);
      if (must_lstrip) {
        text = clear_final_line_if_whitespace(text);
      }

      if (text.empty()) {
        goto again; // don't generate empty token
      }
      return Token(Token::Kind::Text, text);
    }
    case State::ExpressionStart: {
      state = State::ExpressionBody;
      pos += config.expression_open.size();
      return make_token(Token::Kind::ExpressionOpen);
    }
    case State::ExpressionStartForceLstrip: {
      state = State::ExpressionBody;
      pos += config.expression_open_force_lstrip.size();
      return make_token(Token::Kind::ExpressionOpen);
    }
    case State::LineStart: {
      state = State::LineBody;
      pos += config.line_statement.size();
      return make_token(Token::Kind::LineStatementOpen);
    }
    case State::StatementStart: {
      state = State::StatementBody;
      pos += config.statement_open.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::StatementStartNoLstrip: {
      state = State::StatementBody;
      pos += config.statement_open_no_lstrip.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::StatementStartForceLstrip: {
      state = State::StatementBody;
      pos += config.statement_open_force_lstrip.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::CommentStart: {
      state = State::CommentBody;
      pos += config.comment_open.size();
      return make_token(Token::Kind::CommentOpen);
    }
    case State::CommentStartForceLstrip: {
      state = State::CommentBody;
      pos += config.comment_open_force_lstrip.size();
      return make_token(Token::Kind::CommentOpen);
    }
    case State::ExpressionBody:
      return scan_body(config.expression_close, Token::Kind::ExpressionClose, config.expression_close_force_rstrip);
    case State::LineBody:
      return scan_body("\n", Token::Kind::LineStatementClose);
    case State::StatementBody:
      return scan_body(config.statement_close, Token::Kind::StatementClose, config.statement_close_force_rstrip, config.trim_blocks);
    case State::CommentBody: {
      // fast-scan to comment close
      const size_t end = m_in.substr(pos).find(config.comment_close);
      if (end == std::string_view::npos) {
        pos = m_in.size();
        return make_token(Token::Kind::Eof);
      }

      // Check for trim pattern
      const bool must_rstrip = inja::string_view::starts_with(m_in.substr(pos + end - 1), config.comment_close_force_rstrip);

      // return the entire comment in the close token
      state = State::Text;
      pos += end + config.comment_close.size();
      Token tok = make_token(Token::Kind::CommentClose);

      if (must_rstrip || config.trim_blocks) {
        skip_whitespaces_and_first_newline();
      }
      return tok;
    }
    }
  }